

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::call_ls(Solver *this,bool use_up_build)

{
  pointer *pplVar1;
  pointer this_00;
  long *plVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint *puVar6;
  iterator iVar7;
  pointer pcVar8;
  pointer plVar9;
  Lit *pLVar10;
  pointer pcVar11;
  ls_solver *this_01;
  bool bVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  int *piVar17;
  vec<Minisat::Watcher> *pvVar18;
  vec<Minisat::Watcher> *pvVar19;
  int i;
  size_t sVar20;
  pointer plVar21;
  size_t sVar22;
  long lVar23;
  undefined7 in_register_00000031;
  long lVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  vec<Minisat::Watcher> *pvVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  vec<Minisat::Watcher> *pvVar34;
  Watcher w;
  vector<int,_std::allocator<int>_> idx_undef_vars;
  vector<int,_std::allocator<int>_> undef_vars;
  lit item;
  vec<Minisat::Watcher> *local_c30;
  allocator_type local_c19;
  vec<Minisat::Watcher> *local_c18;
  ulong local_c10;
  Watcher local_c08;
  ls_solver *local_c00;
  vec<Minisat::Watcher> *local_bf8;
  vec<Minisat::Watcher> *local_bf0;
  ulong local_be8;
  undefined4 local_bdc;
  vector<int,_std::allocator<int>_> local_bd8;
  ulong local_bc0;
  size_t local_bb8;
  int *local_bb0;
  vector<int,_std::allocator<int>_> local_ba8;
  vec<Minisat::Watcher> *local_b90;
  ls_solver local_b88;
  
  if (this->use_ccnr != true) {
    return false;
  }
  local_bdc = (undefined4)CONCAT71(in_register_00000031,use_up_build);
  this->called_initial_sls = true;
  CCNR::ls_solver::ls_solver(&local_b88);
  local_c00 = &this->ccnr;
  CCNR::ls_solver::operator=(local_c00,&local_b88);
  CCNR::ls_solver::~ls_solver(&local_b88);
  uVar26 = (this->vardata).sz;
  if (this->sls_var_lim != -1 && this->sls_var_lim < (int)uVar26) {
LAB_0011998e:
    this->use_ccnr = false;
    return false;
  }
  lVar14 = (long)(this->learnts_tier2).sz + (long)(this->learnts_core).sz + (long)(this->clauses).sz
  ;
  if ((this->sls_clause_lim != -1) && (this->sls_clause_lim < (int)lVar14)) goto LAB_0011998e;
  local_bb8 = (size_t)(int)uVar26;
  local_bb0 = &(this->trail).sz;
  piVar17 = local_bb0;
  if (0 < (this->trail_lim).sz) {
    piVar17 = (this->trail_lim).data;
  }
  iVar13 = *piVar17;
  iVar16 = (this->assumptions).sz;
  (this->ccnr)._num_vars = local_bb8;
  (this->ccnr)._num_clauses = lVar14 + iVar16 + (long)iVar13;
  (this->ccnr)._max_mems = this->ls_mems_num;
  bVar12 = CCNR::ls_solver::make_space(local_c00);
  if (!bVar12) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"c ls solver make space error.",0x1d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
    return false;
  }
  local_bc0 = (ulong)uVar26;
  local_bf0 = (vec<Minisat::Watcher> *)&this->learnts_core;
  local_b90 = (vec<Minisat::Watcher> *)&this->learnts_tier2;
  local_bf8 = (vec<Minisat::Watcher> *)&this->clauses;
  local_c30 = (vec<Minisat::Watcher> *)0x0;
  iVar13 = 0;
  do {
    pvVar18 = local_bf0;
    if ((iVar13 != 1) && (pvVar18 = local_bf8, iVar13 != 0)) {
      pvVar18 = local_b90;
    }
    local_c10 = (ulong)pvVar18->sz;
    if (0 < (long)local_c10) {
      local_be8 = CONCAT44(local_be8._4_4_,iVar13);
      local_c30 = (vec<Minisat::Watcher> *)(long)(int)local_c30;
      uVar28 = 0;
      local_c18 = pvVar18;
      do {
        uVar33 = (ulong)(&local_c18->data->cref)[uVar28];
        puVar6 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        uVar30 = *(ulong *)(puVar6 + uVar33) >> 0x22;
        if (uVar30 != 0) {
          uVar32 = 0;
          do {
            uVar26 = puVar6[uVar33 + uVar32 + 2];
            uVar15 = (int)uVar26 >> 1;
            uVar4 = ~uVar15;
            if ((uVar26 & 1) == 0) {
              uVar4 = uVar15 + 1;
            }
            pcVar8 = (this->ccnr)._clauses.
                     super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
                     super__Vector_impl_data._M_start + (long)local_c30;
            uVar26 = -uVar4;
            if (0 < (int)uVar4) {
              uVar26 = uVar4;
            }
            local_b88._inst_file._M_string_length = (size_type)uVar26;
            local_b88._inst_file._M_dataplus._M_p._0_4_ =
                 (uint)(0 < (int)uVar4) | (int)local_c30 * 2;
            iVar7._M_current =
                 (pcVar8->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (pcVar8->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::_M_realloc_insert<CCNR::lit>
                        (&pcVar8->literals,iVar7,(lit *)&local_b88);
            }
            else {
              *(pointer *)iVar7._M_current = local_b88._inst_file._M_dataplus._M_p;
              (iVar7._M_current)->var_num = local_b88._inst_file._M_string_length;
              pplVar1 = &(pcVar8->literals).
                         super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *pplVar1 = *pplVar1 + 1;
            }
            uVar32 = uVar32 + 1;
          } while (uVar30 != uVar32);
        }
        local_c30 = (vec<Minisat::Watcher> *)((long)local_c30 + 1);
        uVar28 = uVar28 + 1;
      } while (uVar28 != local_c10);
      iVar13 = (int)local_be8;
    }
    iVar13 = iVar13 + 1;
  } while (iVar13 != 3);
  iVar13 = (this->trail_lim).sz;
  if (iVar13 < 1) {
    if ((iVar13 == 0) && (lVar14 = (long)(this->trail).sz, 0 < lVar14)) {
      lVar23 = (long)(int)local_c30 * 0x28;
      iVar13 = (int)local_c30 * 2;
      lVar31 = 0;
      do {
        pcVar8 = (this->ccnr)._clauses.
                 super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar26 = (this->trail).data[lVar31].x;
        uVar15 = (int)uVar26 >> 1;
        uVar4 = ~uVar15;
        if ((uVar26 & 1) == 0) {
          uVar4 = uVar15 + 1;
        }
        uVar26 = -uVar4;
        if (0 < (int)uVar4) {
          uVar26 = uVar4;
        }
        local_b88._inst_file._M_string_length = (size_type)uVar26;
        local_b88._inst_file._M_dataplus._M_p._0_4_ = (uint)(0 < (int)uVar4) + iVar13;
        iVar7._M_current =
             *(lit **)((long)&(pcVar8->literals).
                              super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                      lVar23 + 8);
        if (iVar7._M_current ==
            *(lit **)((long)&(pcVar8->literals).
                             super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                     lVar23 + 0x10)) {
          std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::_M_realloc_insert<CCNR::lit>
                    ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
                     ((long)&(pcVar8->literals).
                             super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                     lVar23),iVar7,(lit *)&local_b88);
        }
        else {
          *(pointer *)iVar7._M_current = local_b88._inst_file._M_dataplus._M_p;
          (iVar7._M_current)->var_num = local_b88._inst_file._M_string_length;
          plVar2 = (long *)((long)&(pcVar8->literals).
                                   super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl
                           + lVar23 + 8);
          *plVar2 = *plVar2 + 0x10;
        }
        lVar31 = lVar31 + 1;
        lVar23 = lVar23 + 0x28;
        iVar13 = iVar13 + 2;
      } while (lVar14 != lVar31);
      iVar13 = (int)lVar31;
      goto LAB_00119c2a;
    }
  }
  else {
    lVar14 = (long)*(this->trail_lim).data;
    if (0 < lVar14) {
      lVar23 = (long)(int)local_c30 * 0x28;
      iVar13 = (int)local_c30 * 2;
      lVar31 = 0;
      do {
        pcVar8 = (this->ccnr)._clauses.
                 super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar26 = (this->trail).data[lVar31].x;
        uVar15 = (int)uVar26 >> 1;
        uVar4 = ~uVar15;
        if ((uVar26 & 1) == 0) {
          uVar4 = uVar15 + 1;
        }
        uVar26 = -uVar4;
        if (0 < (int)uVar4) {
          uVar26 = uVar4;
        }
        local_b88._inst_file._M_string_length = (size_type)uVar26;
        local_b88._inst_file._M_dataplus._M_p._0_4_ = (uint)(0 < (int)uVar4) + iVar13;
        iVar7._M_current =
             *(lit **)((long)&(pcVar8->literals).
                              super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                      lVar23 + 8);
        if (iVar7._M_current ==
            *(lit **)((long)&(pcVar8->literals).
                             super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                     lVar23 + 0x10)) {
          std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::_M_realloc_insert<CCNR::lit>
                    ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
                     ((long)&(pcVar8->literals).
                             super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                     lVar23),iVar7,(lit *)&local_b88);
        }
        else {
          *(pointer *)iVar7._M_current = local_b88._inst_file._M_dataplus._M_p;
          (iVar7._M_current)->var_num = local_b88._inst_file._M_string_length;
          plVar2 = (long *)((long)&(pcVar8->literals).
                                   super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl
                           + lVar23 + 8);
          *plVar2 = *plVar2 + 0x10;
        }
        lVar31 = lVar31 + 1;
        lVar23 = lVar23 + 0x28;
        iVar13 = iVar13 + 2;
      } while (lVar14 != lVar31);
      iVar13 = (int)lVar31;
LAB_00119c2a:
      local_c30._0_4_ = (int)local_c30 + iVar13;
    }
  }
  iVar13 = (this->assumptions).sz;
  if (0 < iVar13) {
    lVar14 = (long)(int)local_c30 * 0x28;
    local_c30._0_4_ = (int)local_c30 * 2;
    lVar23 = 0;
    do {
      pcVar8 = (this->ccnr)._clauses.super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar26 = (this->assumptions).data[lVar23].x;
      uVar15 = (int)uVar26 >> 1;
      uVar4 = ~uVar15;
      if ((uVar26 & 1) == 0) {
        uVar4 = uVar15 + 1;
      }
      uVar26 = -uVar4;
      if (0 < (int)uVar4) {
        uVar26 = uVar4;
      }
      local_b88._inst_file._M_string_length = (size_type)uVar26;
      local_b88._inst_file._M_dataplus._M_p._0_4_ = (uint)(0 < (int)uVar4) + (int)local_c30;
      iVar7._M_current =
           *(lit **)((long)&(pcVar8->literals).
                            super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                    lVar14 + 8);
      if (iVar7._M_current ==
          *(lit **)((long)&(pcVar8->literals).
                           super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                   lVar14 + 0x10)) {
        std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::_M_realloc_insert<CCNR::lit>
                  ((vector<CCNR::lit,_std::allocator<CCNR::lit>_> *)
                   ((long)&(pcVar8->literals).
                           super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                   lVar14),iVar7,(lit *)&local_b88);
      }
      else {
        *(pointer *)iVar7._M_current = local_b88._inst_file._M_dataplus._M_p;
        (iVar7._M_current)->var_num = local_b88._inst_file._M_string_length;
        plVar2 = (long *)((long)&(pcVar8->literals).
                                 super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl +
                         lVar14 + 8);
        *plVar2 = *plVar2 + 0x10;
      }
      lVar23 = lVar23 + 1;
      iVar13 = (this->assumptions).sz;
      lVar14 = lVar14 + 0x28;
      local_c30._0_4_ = (int)local_c30 + 2;
    } while (lVar23 < iVar13);
  }
  if (0 < (this->trail_lim).sz) {
    local_bb0 = (this->trail_lim).data;
  }
  iVar16 = *local_bb0;
  if (0 < (long)iVar16) {
    lVar14 = 0;
    do {
      iVar13 = (this->trail).data[lVar14].x >> 1;
      (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar13] = (this->assigns).data[iVar13].value == '\0';
      lVar14 = lVar14 + 1;
    } while (iVar16 != lVar14);
    iVar13 = (this->assumptions).sz;
  }
  if (0 < iVar13) {
    lVar14 = 0;
    do {
      iVar13 = (this->assumptions).data[lVar14].x >> 1;
      (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[iVar13] = (this->assigns).data[iVar13].value == '\0';
      lVar14 = lVar14 + 1;
    } while (lVar14 < (this->assumptions).sz);
  }
  uVar28 = (this->ccnr)._num_clauses;
  if (uVar28 != 0) {
    uVar33 = 0;
    do {
      pcVar8 = (this->ccnr)._clauses.super__Vector_base<CCNR::clause,_std::allocator<CCNR::clause>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar21 = *(pointer *)
                 &pcVar8[uVar33].literals.super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>.
                  _M_impl;
      plVar9 = *(pointer *)
                ((long)&pcVar8[uVar33].literals.
                        super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
      if (plVar21 != plVar9) {
        do {
          local_b88._inst_file._M_dataplus._M_p = *(pointer *)plVar21;
          local_b88._inst_file._M_string_length = plVar21->var_num;
          this_00 = (this->ccnr)._vars.
                    super__Vector_base<CCNR::variable,_std::allocator<CCNR::variable>_>._M_impl.
                    super__Vector_impl_data._M_start + (int)local_b88._inst_file._M_string_length;
          iVar7._M_current =
               *(pointer *)
                ((long)&(this_00->literals).
                        super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8);
          if (iVar7._M_current ==
              *(pointer *)
               ((long)&(this_00->literals).super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>
                       ._M_impl + 0x10)) {
            std::vector<CCNR::lit,std::allocator<CCNR::lit>>::_M_realloc_insert<CCNR::lit_const&>
                      ((vector<CCNR::lit,std::allocator<CCNR::lit>> *)this_00,iVar7,
                       (lit *)&local_b88);
          }
          else {
            sVar22 = plVar21->var_num;
            *(undefined8 *)iVar7._M_current = *(undefined8 *)plVar21;
            (iVar7._M_current)->var_num = sVar22;
            pplVar1 = (pointer *)
                      ((long)&(this_00->literals).
                              super__Vector_base<CCNR::lit,_std::allocator<CCNR::lit>_>._M_impl + 8)
            ;
            *pplVar1 = *pplVar1 + 1;
          }
          plVar21 = plVar21 + 1;
        } while (plVar21 != plVar9);
        uVar28 = (this->ccnr)._num_clauses;
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 < uVar28);
  }
  this_01 = local_c00;
  CCNR::ls_solver::build_neighborhood(local_c00);
  if ((char)local_bdc == '\0') {
    bVar12 = CCNR::ls_solver::local_search(this_01,&this->ls_mediation_soln);
    sVar22 = local_bb8;
    uVar28 = local_bc0;
  }
  else {
    iVar13 = (this->vardata).sz;
    iVar16 = (this->trail).sz;
    uVar26 = this->qhead;
    uVar28 = (ulong)uVar26;
    std::vector<Minisat::Lit,_std::allocator<Minisat::Lit>_>::vector
              ((vector<Minisat::Lit,_std::allocator<Minisat::Lit>_> *)&local_b88,(long)(iVar13 + 2),
               (allocator_type *)&local_ba8);
    lVar14 = (long)this->qhead;
    if (this->qhead < iVar16) {
      pLVar10 = (this->trail).data;
      do {
        *(int *)(local_b88._inst_file._M_dataplus._M_p + lVar14 * 4) = pLVar10[lVar14].x;
        lVar14 = lVar14 + 1;
      } while (iVar16 != lVar14);
    }
    std::vector<int,_std::allocator<int>_>::vector
              (&local_ba8,(long)((iVar13 + 2) - iVar16),(allocator_type *)&local_bd8);
    local_c08.cref = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_bd8,(long)iVar13 + 1,(value_type_conflict1 *)&local_c08,&local_c19);
    if (0 < iVar13) {
      uVar26 = iVar16 - uVar26;
      lVar14 = 0;
      iVar16 = 0;
      do {
        bVar3 = (this->assigns).data[lVar14].value;
        if ((bVar3 & 2) == 0) {
          (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14] = bVar3 == 0;
        }
        else {
          local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar14] = iVar16;
          lVar23 = (long)iVar16;
          iVar16 = iVar16 + 1;
          local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar23] = (int)lVar14;
        }
        lVar14 = lVar14 + 1;
      } while (iVar13 != lVar14);
      if (0 < iVar16) {
        do {
          uVar33 = (ulong)uVar26;
          iVar13 = iVar16;
          if ((int)uVar28 < (int)uVar26) {
            uVar28 = (ulong)(int)uVar28;
            do {
              uVar26 = *(uint *)(local_b88._inst_file._M_dataplus._M_p + uVar28 * 4);
              lVar23 = (long)(int)uVar26;
              pvVar18 = (this->watches_bin).occs.data;
              pvVar34 = (vec<Minisat::Watcher> *)(lVar23 * 0x10);
              lVar14 = (long)*(int *)((long)&pvVar34->sz + (long)pvVar18);
              local_be8 = uVar28;
              if (0 < lVar14) {
                lVar31 = 0;
                do {
                  iVar16 = *(int *)(*(long *)((long)&pvVar34->data + (long)pvVar18) + 4 + lVar31 * 8
                                   );
                  iVar25 = iVar16 >> 1;
                  if (-1 < local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar25]) {
                    (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar25] = ~(byte)iVar16 & 1;
                    iVar27 = (int)uVar33;
                    uVar33 = (ulong)(iVar27 + 1);
                    *(int *)(local_b88._inst_file._M_dataplus._M_p + (long)iVar27 * 4) = iVar16;
                    lVar24 = (long)iVar13;
                    iVar13 = iVar13 + -1;
                    iVar16 = local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar24 + -1];
                    iVar27 = local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar25];
                    local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar27] = iVar16;
                    local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar16] = iVar27;
                    local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar25] = -1;
                  }
                  lVar31 = lVar31 + 1;
                } while (lVar14 != lVar31);
                if (iVar13 == 0) goto LAB_0011a2d7;
              }
              pvVar19 = (this->watches).occs.data;
              local_c30 = (vec<Minisat::Watcher> *)pvVar19[lVar23].data;
              pvVar18 = local_c30;
              local_c10 = uVar33;
              if ((long)pvVar19[lVar23].sz != 0) {
                pvVar18 = (vec<Minisat::Watcher> *)(&local_c30->data + pvVar19[lVar23].sz);
                uVar26 = uVar26 ^ 1;
                pvVar29 = local_c30;
                local_c18 = pvVar18;
                local_bf8 = pvVar19;
                local_bf0 = pvVar34;
                do {
                  local_c08.cref = *(CRef *)&pvVar29->data;
                  puVar6 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                  local_c08.blocker.x = puVar6[(ulong)local_c08.cref + 2];
                  if (local_c08.blocker.x == uVar26) {
                    local_c08.blocker.x = puVar6[(ulong)local_c08.cref + 3];
                    puVar6[(ulong)local_c08.cref + 2] = local_c08.blocker.x;
                    puVar6[(ulong)local_c08.cref + 3] = uVar26;
                  }
                  iVar16 = local_c08.blocker.x >> 1;
                  if ((local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar16] == -1) &&
                     ((local_c08.blocker.x & 1U ^
                      (int)(this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar16]) == 1)) {
                    local_c30->data = (Watcher *)CONCAT44(local_c08.blocker.x,local_c08.cref);
                    local_c30 = (vec<Minisat::Watcher> *)&local_c30->sz;
                  }
                  else {
                    if (2 < (uint)(*(ulong *)(puVar6 + local_c08.cref) >> 0x22)) {
                      lVar14 = 0;
                      do {
                        uVar4 = puVar6[(ulong)local_c08.cref + lVar14 + 4];
                        if ((local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)uVar4 >> 1] != -1) ||
                           ((uVar4 & 1) !=
                            (int)(this->ls_mediation_soln).
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start[(int)uVar4 >> 1])) {
                          puVar6[(ulong)local_c08.cref + 3] = uVar4;
                          puVar6[(ulong)local_c08.cref + lVar14 + 4] = uVar26;
                          vec<Minisat::Watcher>::push
                                    ((this->watches).occs.data +
                                     ((long)(int)puVar6[(ulong)local_c08.cref + 3] ^ 1),&local_c08);
                          pvVar18 = local_c18;
                          goto LAB_0011a201;
                        }
                        lVar14 = lVar14 + 1;
                      } while ((*(ulong *)(puVar6 + local_c08.cref) >> 0x22) - 2 != lVar14);
                    }
                    local_c30->data = (Watcher *)CONCAT44(local_c08.blocker.x,local_c08.cref);
                    local_c30 = (vec<Minisat::Watcher> *)&local_c30->sz;
                    pcVar11 = (this->ls_mediation_soln).
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start;
                    pvVar18 = local_c18;
                    if ((local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar16] != -1) ||
                       ((local_c08.blocker.x & 1U) != (int)pcVar11[iVar16])) {
                      pcVar11[iVar16] = ~(byte)local_c08.blocker.x & 1;
                      iVar25 = (int)local_c10;
                      local_c10 = (ulong)(iVar25 + 1);
                      *(int *)(local_b88._inst_file._M_dataplus._M_p + (long)iVar25 * 4) =
                           local_c08.blocker.x;
                      lVar14 = (long)iVar13;
                      iVar13 = iVar13 + -1;
                      iVar25 = local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar14 + -1];
                      iVar27 = local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar16];
                      local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar27] = iVar25;
                      local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar25] = iVar27;
                      local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar16] = -1;
                    }
                  }
LAB_0011a201:
                  pvVar29 = (vec<Minisat::Watcher> *)&pvVar29->sz;
                  pvVar19 = local_bf8;
                  pvVar34 = local_bf0;
                } while (pvVar29 != pvVar18);
              }
              iVar16 = (int)((ulong)((long)pvVar18 - (long)local_c30) >> 3);
              if (0 < iVar16) {
                piVar17 = (int *)((long)&pvVar34->sz + (long)&pvVar19->data);
                *piVar17 = *piVar17 - iVar16;
              }
              uVar28 = local_be8 + 1;
            } while (((long)uVar28 < (long)(int)local_c10) && (uVar33 = local_c10, 0 < iVar13));
            uVar33 = local_c10;
            if (iVar13 == 0) break;
          }
          iVar16 = rand();
          iVar25 = local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar16 % iVar13];
          bVar12 = (this->polarity).data[iVar25] == '\0';
          (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar25] = bVar12;
          uVar26 = (int)uVar33 + 1;
          *(uint *)(local_b88._inst_file._M_dataplus._M_p + (long)(int)uVar33 * 4) =
               (uint)!bVar12 + iVar25 * 2;
          iVar16 = iVar13 + -1;
          iVar27 = local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[(long)iVar13 + -1];
          iVar5 = local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar25];
          local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar5] = iVar27;
          local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar27] = iVar5;
          local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar25] = -1;
        } while (1 < iVar13);
      }
    }
LAB_0011a2d7:
    bVar12 = CCNR::ls_solver::local_search(local_c00,&this->ls_mediation_soln);
    sVar22 = local_bb8;
    uVar28 = local_bc0;
    if (local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_bd8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_ba8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b88._inst_file._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_b88._inst_file._M_dataplus._M_p);
    }
  }
  if ((int)uVar28 < 1) {
    iVar13 = (int)(this->ccnr)._best_found_cost;
    if (this->ls_best_unsat_num < iVar13) goto LAB_0011a3d8;
  }
  else {
    uVar33 = 0;
    do {
      (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar33] =
           (this->ccnr)._best_solution.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[uVar33 + 1];
      uVar33 = uVar33 + 1;
    } while (uVar28 != uVar33);
    iVar13 = (int)(this->ccnr)._best_found_cost;
    if (this->ls_best_unsat_num < iVar13) goto LAB_0011a3d8;
    if (0 < (int)uVar28) {
      sVar20 = 0;
      do {
        (this->ls_best_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start[sVar20] =
             (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[sVar20];
        sVar20 = sVar20 + 1;
      } while (sVar22 != sVar20);
    }
  }
  this->ls_best_unsat_num = iVar13;
LAB_0011a3d8:
  if (bVar12 == false) {
    return false;
  }
  this->solved_by_ls = true;
  return true;
}

Assistant:

bool Solver::call_ls(bool use_up_build)
{
    if (!use_ccnr) return false;

    called_initial_sls = true;

    ccnr = CCNR::ls_solver();
    int ls_var_nums = nVars();
    int ls_cls_nums = nClauses() + learnts_core.size() + learnts_tier2.size();

    /* allow to disable SLS for larger clauses */
    if ((sls_var_lim != -1 && nVars() > sls_var_lim) || (sls_clause_lim != -1 && ls_cls_nums > sls_clause_lim)) {
        use_ccnr = false;
        return false;
    }

    if (trail_lim.size() > 0)
        ls_cls_nums += trail_lim[0];
    else
        ls_cls_nums += trail.size();

    ls_cls_nums += assumptions.size();

    ccnr._num_vars = ls_var_nums;
    ccnr._num_clauses = ls_cls_nums;
    ccnr._max_mems = ls_mems_num;
    if (!ccnr.make_space()) {
        std::cout << "c ls solver make space error." << std::endl;
        return false;
    }


    // build_instance
    int ct = 0;
    for (int idx = 0; idx < 3; ++idx) {
        vec<CRef> &vs = (idx == 0) ? clauses : (idx == 1 ? learnts_core : (idx == 2 ? learnts_tier2 : learnts_local));
        int vs_sz = vs.size();
        for (int i = 0; i < vs_sz; i++) {
            CRef &cr = vs[i];
            Clause &c = ca[cr];
            int cls_sz = c.size();
            for (int j = 0; j < cls_sz; j++) {
                int cur_lit = toFormal(c[j]);
                ccnr._clauses[ct].literals.push_back(CCNR::lit(cur_lit, ct));
            }
            ct++;
        }
    }
    if (trail_lim.size() > 0) {
        int cls_sz = trail_lim[0];
        for (int i = 0; i < cls_sz; i++) {
            ccnr._clauses[ct].literals.push_back(CCNR::lit(toFormal(trail[i]), ct));
            ct++;
        }
    } else if (trail_lim.size() == 0) {
        int trl_sz = trail.size();
        for (int i = 0; i < trl_sz; i++) {
            ccnr._clauses[ct].literals.push_back(CCNR::lit(toFormal(trail[i]), ct));
            ct++;
        }
    }

    for (int i = 0; i < assumptions.size(); i++) {
        ccnr._clauses[ct].literals.push_back(CCNR::lit(toFormal(assumptions[i]), ct));
        ct++;
    }

    // set top level literals in SLS engine
    int topLevel = trail_lim.size() > 0 ? trail_lim[0] : trail.size();
    for (int i = 0; i < topLevel; ++i) {
        Var v = var(trail[i]);
        ls_mediation_soln[v] = (value(v) == l_True) ? 1 : 0;
    }
    // set assignment variables
    for (int i = 0; i < assumptions.size(); i++) {
        Var v = var(assumptions[i]);
        ls_mediation_soln[v] = (value(v) == l_True) ? 1 : 0;
    }

    for (size_t c = 0; c < ccnr._num_clauses; c++) {
        for (CCNR::lit item : ccnr._clauses[c].literals) {
            int v = item.var_num;
            ccnr._vars[v].literals.push_back(item);
        }
    }
    ccnr.build_neighborhood();


    bool res = false;
    if (use_up_build) { // do unit propagate negalate conflicts.

        // load init_soln use UP
        int var_nums = nVars();
        int t_sz = trail.size();
        int idx = qhead;

        int viewList_sz = t_sz - qhead;
        std::vector<Lit> viewList(var_nums + 2);
        for (int i = qhead; i < t_sz; ++i) viewList[i] = trail[i];

        int undef_nums = 0;
        std::vector<int> undef_vars(var_nums - t_sz + 2);
        std::vector<int> idx_undef_vars(var_nums + 1, -1); // undef_vars' idx is not -1
        for (int i = 0; i < var_nums; ++i)
            if (value(i) == l_Undef) {
                idx_undef_vars[i] = undef_nums;
                undef_vars[undef_nums++] = i;
            } else {
                ls_mediation_soln[i] = (value(i) == l_True) ? 1 : 0;
            }

        while (undef_nums > 0) {
            while (idx < viewList_sz && undef_nums > 0) {
                Lit p = viewList[idx++];

                vec<Watcher> &ws_bin = watches_bin[p];
                int ws_bin_sz = ws_bin.size();
                for (int k = 0; k < ws_bin_sz; k++) {
                    Lit the_other = ws_bin[k].blocker;
                    Var the_other_var = var(the_other);
                    if (idx_undef_vars[the_other_var] > -1) {
                        // no conflict and can decide.
                        ls_mediation_soln[the_other_var] = sign(the_other) ? 0 : 1;
                        viewList[viewList_sz++] = the_other;

                        int end_var = undef_vars[--undef_nums];
                        int idx_end_var = idx_undef_vars[the_other_var];
                        undef_vars[idx_end_var] = end_var;
                        idx_undef_vars[end_var] = idx_end_var;
                        idx_undef_vars[the_other_var] = -1;
                    }
                }
                if (undef_nums == 0) break;

                vec<Watcher> &ws = watches[p];
                Watcher *i, *j, *end;
                for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
                    // Make sure the false literal is data[1]:
                    CRef cr = i->cref;
                    Clause &c = ca[cr];
                    Lit false_lit = ~p;
                    if (c[0] == false_lit) c[0] = c[1], c[1] = false_lit;
                    i++;

                    // If 0th watch is true, then clause is already satisfied.
                    Lit first = c[0];
                    Var first_var = var(first);
                    Watcher w = Watcher(cr, first);
                    if (idx_undef_vars[first_var] == -1 && ls_mediation_soln[first_var] == (!sign(first))) {
                        *j++ = w;
                        continue;
                    }

                    int c_sz = c.size();
                    for (int k = 2; k < c_sz; ++k) {
                        Lit tmp_lit = c[k];
                        Var tmp_var = var(tmp_lit);
                        if (idx_undef_vars[tmp_var] == -1 && ls_mediation_soln[tmp_var] == sign(tmp_lit)) {
                        } else {
                            c[1] = c[k];
                            c[k] = false_lit;
                            watches[~c[1]].push(w);
                            // next clause
                            goto check_next_clause;
                        }
                    }
                    *j++ = w;
                    if (idx_undef_vars[first_var] == -1 && ls_mediation_soln[first_var] == sign(first)) {
                        // confliction bump
                        //?need to break or go on ?
                        continue;
                    } else {
                        // unit can assign
                        ls_mediation_soln[first_var] = sign(first) ? 0 : 1;
                        viewList[viewList_sz++] = first;

                        int end_var = undef_vars[--undef_nums];
                        int idx_end_var = idx_undef_vars[first_var];
                        undef_vars[idx_end_var] = end_var;
                        idx_undef_vars[end_var] = idx_end_var;
                        idx_undef_vars[first_var] = -1;
                    }
                check_next_clause:;
                }
                ws.shrink(i - j);
            }

            if (undef_nums == 0) break;

            // pick and assign
            // method 1: rand pick and rand assign
            int choosevar_idx = rand() % undef_nums;
            Var choosevar = undef_vars[choosevar_idx];
            Lit choose = mkLit(choosevar, polarity[choosevar]);

            ls_mediation_soln[choosevar] = sign(choose) ? 0 : 1;
            viewList[viewList_sz++] = choose;

            int end_var = undef_vars[--undef_nums];
            int idx_end_var = idx_undef_vars[choosevar];
            undef_vars[idx_end_var] = end_var;
            idx_undef_vars[end_var] = idx_end_var;
            idx_undef_vars[choosevar] = -1;
        }
        // call ccanr
        res = ccnr.local_search(&ls_mediation_soln);

    } else {
        // use total rand mod, however, respect top level literals and assumptions!
        // call ccanr use rand assign
        res = ccnr.local_search(&ls_mediation_soln);
    }


    // reload mediation soln
    for (int i = 0; i < ls_var_nums; ++i) {
        ls_mediation_soln[i] = ccnr._best_solution[i + 1];
    }

    int ls_unsat_back_num = ccnr._best_found_cost;
    if (ls_unsat_back_num <= ls_best_unsat_num) {
        for (int i = 0; i < ls_var_nums; ++i) ls_best_soln[i] = ls_mediation_soln[i];
        ls_best_unsat_num = ls_unsat_back_num;
    }

    if (res == true) {
        solved_by_ls = true;
    }
    return res;
}